

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O3

size_t qHash(QUrl *url,size_t seed)

{
  QUrlPrivate *pQVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  QStringView key;
  QStringView key_00;
  QStringView key_01;
  QStringView key_02;
  QStringView key_03;
  QStringView key_04;
  QStringView key_05;
  
  pQVar1 = url->d;
  if (pQVar1 == (QUrlPrivate *)0x0) {
    uVar6 = (~seed >> 0x20 ^ ~seed) * -0x2917014799a6026d;
    uVar6 = (uVar6 >> 0x20 ^ uVar6) * -0x2917014799a6026d;
    sVar2 = uVar6 >> 0x20 ^ uVar6;
  }
  else {
    key.m_data = (pQVar1->scheme).d.ptr;
    key.m_size = (pQVar1->scheme).d.size;
    sVar2 = qHash(key,0);
    key_00.m_data = (pQVar1->userName).d.ptr;
    key_00.m_size = (pQVar1->userName).d.size;
    sVar3 = qHash(key_00,0);
    key_01.m_data = (pQVar1->password).d.ptr;
    key_01.m_size = (pQVar1->password).d.size;
    sVar4 = qHash(key_01,0);
    key_02.m_data = (pQVar1->host).d.ptr;
    key_02.m_size = (pQVar1->host).d.size;
    sVar5 = qHash(key_02,0);
    uVar6 = (long)pQVar1->port ^ seed;
    uVar6 = (uVar6 >> 0x20 ^ uVar6) * -0x2917014799a6026d;
    uVar6 = (uVar6 >> 0x20 ^ uVar6) * -0x2917014799a6026d;
    key_03.m_data = (pQVar1->path).d.ptr;
    key_03.m_size = (pQVar1->path).d.size;
    sVar7 = qHash(key_03,0);
    key_04.m_data = (pQVar1->query).d.ptr;
    key_04.m_size = (pQVar1->query).d.size;
    sVar8 = qHash(key_04,0);
    key_05.m_data = (pQVar1->fragment).d.ptr;
    key_05.m_size = (pQVar1->fragment).d.size;
    sVar9 = qHash(key_05,0);
    sVar2 = sVar8 ^ sVar7 ^ sVar5 ^ sVar4 ^ sVar3 ^ sVar2 ^ sVar9 ^ uVar6 ^ uVar6 >> 0x20;
  }
  return sVar2;
}

Assistant:

size_t qHash(const QUrl &url, size_t seed) noexcept
{
    if (!url.d)
        return qHash(-1, seed); // the hash of an unset port (-1)

    return qHash(url.d->scheme) ^
            qHash(url.d->userName) ^
            qHash(url.d->password) ^
            qHash(url.d->host) ^
            qHash(url.d->port, seed) ^
            qHash(url.d->path) ^
            qHash(url.d->query) ^
            qHash(url.d->fragment);
}